

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::Logger(Logger *this,Logger *logger)

{
  long in_RSI;
  undefined8 *in_RDI;
  Configurations *pCVar1;
  Configurations *in_stack_ffffffffffffffb0;
  Configurations *this_00;
  
  el::base::threading::ThreadSafe::ThreadSafe((ThreadSafe *)0x26771d);
  Loggable::Loggable((Loggable *)(in_RDI + 2));
  *in_RDI = &PTR_acquireLock_002d4430;
  in_RDI[2] = &PTR__Logger_002d4470;
  std::__cxx11::string::string((string *)(in_RDI + 3));
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x39));
  Configurations::Configurations(in_stack_ffffffffffffffb0);
  pCVar1 = (Configurations *)(in_RDI + 0x48);
  el::base::utils::std::
  map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::map((map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
         *)0x2677ab);
  this_00 = (Configurations *)(in_RDI + 0x4f);
  el::base::utils::std::shared_ptr<el::LogBuilder>::shared_ptr
            ((shared_ptr<el::LogBuilder> *)0x2677c1);
  el::base::utils::safeDelete<el::base::TypedConfigurations>((TypedConfigurations **)this_00);
  std::__cxx11::string::operator=((string *)(in_RDI + 3),(string *)(in_RSI + 0x18));
  in_RDI[7] = *(undefined8 *)(in_RSI + 0x38);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x39),(string *)(in_RSI + 0x1c8));
  *(byte *)(in_RDI + 0x3d) = *(byte *)(in_RSI + 0x1e8) & 1;
  Configurations::operator=(this_00,pCVar1);
  el::base::utils::std::
  map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::operator=((map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
               *)this_00,
              (map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
               *)pCVar1);
  in_RDI[0x4e] = *(undefined8 *)(in_RSI + 0x270);
  return;
}

Assistant:

Logger::Logger(const Logger& logger) {
  base::utils::safeDelete(m_typedConfigurations);
  m_id = logger.m_id;
  m_typedConfigurations = logger.m_typedConfigurations;
  m_parentApplicationName = logger.m_parentApplicationName;
  m_isConfigured = logger.m_isConfigured;
  m_configurations = logger.m_configurations;
  m_unflushedCount = logger.m_unflushedCount;
  m_logStreamsReference = logger.m_logStreamsReference;
}